

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeToFieldMask
          (FieldMaskTree *this,FieldMask *mask)

{
  FieldMask *in_RCX;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  MergeToFieldMask((FieldMaskTree *)local_48,(string *)this,(Node *)mask,in_RCX);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void FieldMaskTree::MergeToFieldMask(FieldMask* mask) {
  MergeToFieldMask("", &root_, mask);
}